

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O2

void __thiscall snmalloc::LocalEntropy::init<snmalloc::PALLinux>(LocalEntropy *this)

{
  uint64_t uVar1;
  
  uVar1 = PALLinux::get_entropy64();
  this->local_key = uVar1;
  uVar1 = PALLinux::get_entropy64();
  this->local_counter = uVar1;
  uVar1 = get_next(this);
  this->bit_source = uVar1;
  return;
}

Assistant:

void init()
    {
      local_key = get_entropy64<PAL>();
      local_counter = get_entropy64<PAL>();
      bit_source = get_next();
    }